

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareDurations(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  long lVar1;
  double dVar2;
  long local_70;
  long maxday;
  long minday;
  long myear;
  long xday;
  long xmon;
  int invert;
  double sec;
  long day;
  long mon;
  long carry;
  xmlSchemaValPtr y_local;
  xmlSchemaValPtr x_local;
  
  xmon._4_4_ = 1;
  if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
    x_local._4_4_ = -2;
  }
  else {
    xday = (long)(x->value).decimal.str - (y->value).date.year;
    dVar2 = (x->value).date.sec - (y->value).date.sec;
    lVar1 = (long)(dVar2 / 86400.0);
    dVar2 = -(double)lVar1 * 86400.0 + dVar2;
    myear = (long)((x->value).qname.uri + (lVar1 - (y->value).dur.day));
    if (xday == 0) {
      if ((xmlChar *)myear == (xmlChar *)0x0) {
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if (0.0 <= dVar2) {
            x_local._4_4_ = 1;
          }
          else {
            x_local._4_4_ = -1;
          }
        }
        else {
          x_local._4_4_ = 0;
        }
      }
      else if (myear < 0) {
        x_local._4_4_ = -1;
      }
      else {
        x_local._4_4_ = 1;
      }
    }
    else {
      if (xday < 1) {
        if ((myear < 1) && (dVar2 <= 0.0)) {
          return -1;
        }
        xmon._4_4_ = -1;
        xday = -xday;
      }
      else {
        if ((-1 < myear) && (0.0 <= dVar2)) {
          return 1;
        }
        myear = -myear;
      }
      lVar1 = xday / 0xc;
      if (lVar1 == 0) {
        maxday = 0;
        local_70 = 0;
      }
      else {
        if (0x5987b1a9448be4 < lVar1) {
          return -2;
        }
        local_70 = lVar1 * 0x16d + (lVar1 + 3) / 4;
        maxday = local_70 + -1;
      }
      lVar1 = xmlSchemaCompareDurations::dayRange[0][xday % 0xc] + maxday;
      local_70 = xmlSchemaCompareDurations::dayRange[1][xday % 0xc] + local_70;
      if ((local_70 == lVar1) && (local_70 == myear)) {
        x_local._4_4_ = 0;
      }
      else if (local_70 < myear) {
        x_local._4_4_ = -xmon._4_4_;
      }
      else if (myear < lVar1) {
        x_local._4_4_ = xmon._4_4_;
      }
      else {
        x_local._4_4_ = 2;
      }
    }
  }
  return x_local._4_4_;
}

Assistant:

static int
xmlSchemaCompareDurations(xmlSchemaValPtr x, xmlSchemaValPtr y)
{
    long carry, mon, day;
    double sec;
    int invert = 1;
    long xmon, xday, myear, minday, maxday;
    static const long dayRange [2][12] = {
        { 0, 28, 59, 89, 120, 150, 181, 212, 242, 273, 303, 334, },
        { 0, 31, 62, 92, 123, 153, 184, 215, 245, 276, 306, 337} };

    if ((x == NULL) || (y == NULL))
        return -2;

    /* months */
    mon = x->value.dur.mon - y->value.dur.mon;

    /* seconds */
    sec = x->value.dur.sec - y->value.dur.sec;
    carry = (long)(sec / SECS_PER_DAY);
    sec -= ((double)carry) * SECS_PER_DAY;

    /* days */
    day = x->value.dur.day - y->value.dur.day + carry;

    /* easy test */
    if (mon == 0) {
        if (day == 0)
            if (sec == 0.0)
                return 0;
            else if (sec < 0.0)
                return -1;
            else
                return 1;
        else if (day < 0)
            return -1;
        else
            return 1;
    }

    if (mon > 0) {
        if ((day >= 0) && (sec >= 0.0))
            return 1;
        else {
            xmon = mon;
            xday = -day;
        }
    } else if ((day <= 0) && (sec <= 0.0)) {
        return -1;
    } else {
	invert = -1;
        xmon = -mon;
        xday = day;
    }

    myear = xmon / 12;
    if (myear == 0) {
	minday = 0;
	maxday = 0;
    } else {
        if (myear > LONG_MAX / 366)
            return -2;
        /* FIXME: This doesn't take leap year exceptions every 100/400 years
           into account. */
	maxday = 365 * myear + (myear + 3) / 4;
        /* FIXME: Needs to be calculated separately */
	minday = maxday - 1;
    }

    xmon = xmon % 12;
    minday += dayRange[0][xmon];
    maxday += dayRange[1][xmon];

    if ((maxday == minday) && (maxday == xday))
	return(0); /* can this really happen ? */
    if (maxday < xday)
        return(-invert);
    if (minday > xday)
        return(invert);

    /* indeterminate */
    return 2;
}